

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::DisposableOwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>::disposeImpl
          (DisposableOwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_> *this,
          void *pointer)

{
  void *pointer_local;
  DisposableOwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_> *this_local;
  
  if (this != (DisposableOwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_> *)0x0) {
    ~DisposableOwnedBundle(this);
    operator_delete(this,0x40);
  }
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }